

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall S2BooleanOperation::Impl::AreRegionsIdentical(Impl *this)

{
  S2ShapeIndex *pSVar1;
  S2ShapeIndex *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  long *plVar8;
  ostream *poVar9;
  undefined1 local_128 [8];
  Edge b_edge;
  Edge a_edge;
  int i;
  S2LogMessage local_b0;
  S2LogMessageVoidify local_99;
  undefined8 local_98;
  Chain b_chain;
  Chain a_chain;
  int c;
  int num_chains;
  ReferencePoint b_ref;
  ReferencePoint a_ref;
  S2Shape *b_shape;
  S2Shape *a_shape;
  int s;
  int num_shape_ids;
  S2ShapeIndex *b;
  S2ShapeIndex *a;
  Impl *this_local;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pSVar1 = this->op_->regions_[0];
  pSVar2 = this->op_->regions_[1];
  if (pSVar1 == pSVar2) {
    this_local._7_1_ = true;
  }
  else {
    iVar4 = (*pSVar1->_vptr_S2ShapeIndex[2])();
    iVar5 = (*pSVar2->_vptr_S2ShapeIndex[2])();
    if (iVar4 == iVar5) {
      for (a_shape._0_4_ = 0; (int)(uint)a_shape < iVar4; a_shape._0_4_ = (uint)a_shape + 1) {
        iVar5 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,(ulong)(uint)a_shape);
        plVar7 = (long *)CONCAT44(extraout_var,iVar5);
        iVar5 = (*pSVar2->_vptr_S2ShapeIndex[3])(pSVar2,(ulong)(uint)a_shape);
        plVar8 = (long *)CONCAT44(extraout_var_00,iVar5);
        iVar5 = (**(code **)(*plVar7 + 0x20))();
        iVar6 = (**(code **)(*plVar8 + 0x20))();
        if (iVar5 != iVar6) {
          return false;
        }
        iVar5 = (**(code **)(*plVar7 + 0x20))();
        if (iVar5 == 2) {
          (**(code **)(*plVar7 + 0x28))(&b_ref.contained);
          (**(code **)(*plVar8 + 0x28))(&c);
          bVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            ((BasicVector<Vector3,_double,_3UL> *)&b_ref.contained,(D *)&c);
          if (bVar3) {
            return false;
          }
          if ((a_ref.point.c_[2]._0_1_ & 1) != (b_ref.point.c_[2]._0_1_ & 1)) {
            return false;
          }
        }
        iVar5 = (**(code **)(*plVar7 + 0x30))();
        iVar6 = (**(code **)(*plVar8 + 0x30))();
        if (iVar5 != iVar6) {
          return false;
        }
        for (a_chain.start = 0; a_chain.start < iVar5; a_chain.start = a_chain.start + 1) {
          b_chain = (Chain)(**(code **)(*plVar7 + 0x38))(plVar7,a_chain.start);
          local_98 = (**(code **)(*plVar8 + 0x38))(plVar8,a_chain.start);
          if (b_chain.start != (int)local_98) {
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&local_b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                       ,0x8a8,kFatal,(ostream *)&std::cerr);
            poVar9 = S2LogMessage::stream(&local_b0);
            poVar9 = std::operator<<(poVar9,"Check failed: (a_chain.start) == (b_chain.start) ");
            S2LogMessageVoidify::operator&(&local_99,poVar9);
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b0);
          }
          local_98._4_4_ = (int)((ulong)local_98 >> 0x20);
          if (b_chain.length != local_98._4_4_) {
            return false;
          }
          for (a_edge.v1.c_[2]._0_4_ = 0; a_edge.v1.c_[2]._0_4_ < b_chain.length;
              a_edge.v1.c_[2]._0_4_ = a_edge.v1.c_[2]._0_4_ + 1) {
            (**(code **)(*plVar7 + 0x40))
                      (b_edge.v1.c_ + 2,plVar7,a_chain.start,a_edge.v1.c_[2]._0_4_);
            (**(code **)(*plVar8 + 0x40))(local_128,plVar8,a_chain.start,a_edge.v1.c_[2]._0_4_);
            bVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                              ((BasicVector<Vector3,_double,_3UL> *)(b_edge.v1.c_ + 2),
                               (D *)local_128);
            if (bVar3) {
              return false;
            }
            bVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                              ((BasicVector<Vector3,_double,_3UL> *)(a_edge.v0.c_ + 2),
                               (D *)(b_edge.v0.c_ + 2));
            if (bVar3) {
              return false;
            }
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::AreRegionsIdentical() const {
  const S2ShapeIndex* a = op_->regions_[0];
  const S2ShapeIndex* b = op_->regions_[1];
  if (a == b) return true;
  int num_shape_ids = a->num_shape_ids();
  if (num_shape_ids != b->num_shape_ids()) return false;
  for (int s = 0; s < num_shape_ids; ++s) {
    const S2Shape* a_shape = a->shape(s);
    const S2Shape* b_shape = b->shape(s);
    if (a_shape->dimension() != b_shape->dimension()) return false;
    if (a_shape->dimension() == 2) {
      auto a_ref = a_shape->GetReferencePoint();
      auto b_ref = b_shape->GetReferencePoint();
      if (a_ref.point != b_ref.point) return false;
      if (a_ref.contained != b_ref.contained) return false;
    }
    int num_chains = a_shape->num_chains();
    if (num_chains != b_shape->num_chains()) return false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain a_chain = a_shape->chain(c);
      S2Shape::Chain b_chain = b_shape->chain(c);
      S2_DCHECK_EQ(a_chain.start, b_chain.start);
      if (a_chain.length != b_chain.length) return false;
      for (int i = 0; i < a_chain.length; ++i) {
        S2Shape::Edge a_edge = a_shape->chain_edge(c, i);
        S2Shape::Edge b_edge = b_shape->chain_edge(c, i);
        if (a_edge.v0 != b_edge.v0) return false;
        if (a_edge.v1 != b_edge.v1) return false;
      }
    }
  }
  return true;
}